

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double burr_cdf(double x,double a,double b,double c,double d)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (a < x) {
    dVar1 = pow((x - a) / b,c);
    dVar1 = pow(dVar1 + 1.0,d);
    dVar1 = 1.0 - 1.0 / dVar1;
  }
  return dVar1;
}

Assistant:

double burr_cdf ( double x, double a, double b, double c, double d )

//****************************************************************************80
//
//  Purpose:
//
//    BURR_CDF evaluates the Burr CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    08 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, C, D, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double BURR_CDF, the value of the CDF.
//
{
  double cdf;
  double y;

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;

    cdf = 1.0 - 1.0 / pow ( 1.0 + pow ( y, c ), d );
  }

  return cdf;
}